

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

void __thiscall Assimp::ColladaParser::ReadAccessor(ColladaParser *this,string *pID)

{
  size_t *psVar1;
  size_t *psVar2;
  size_t *psVar3;
  char *pcVar4;
  size_type sVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  ulong uVar10;
  mapped_type *pmVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  long lVar12;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ostream *poVar13;
  size_t *psVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  char *__s;
  string type;
  char *source;
  string name;
  ulong local_208;
  undefined1 local_1e8 [40];
  char *local_1c0;
  size_t *local_1b8;
  char *local_1b0;
  value_type local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  size_t local_170;
  size_t sStack_168;
  size_t local_160;
  size_t sStack_158;
  undefined1 *local_150;
  undefined8 local_148;
  undefined1 local_140;
  undefined7 uStack_13f;
  Data *local_130;
  
  uVar6 = GetAttribute(this,"source");
  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
  local_1c0 = (char *)CONCAT44(extraout_var,iVar7);
  if (*local_1c0 != '#') {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"Unknown reference format in url \"",0x21);
    poVar13 = (ostream *)
              Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
              operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1a8,&local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar13,"\" in source attribute of <accessor> element.",0x2c);
    std::__cxx11::stringbuf::str();
    ThrowException(this,(string *)local_1e8);
  }
  uVar6 = GetAttribute(this,"count");
  uVar6 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar6);
  uVar8 = TestAttribute(this,"offset");
  if ((int)uVar8 < 0) {
    local_208 = 0;
  }
  else {
    uVar8 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar8);
    local_208 = (ulong)uVar8;
  }
  uVar8 = TestAttribute(this,"stride");
  if ((int)uVar8 < 0) {
    uVar10 = 1;
  }
  else {
    uVar8 = (*this->mReader->_vptr_IIrrXMLReader[10])(this->mReader,(ulong)uVar8);
    uVar10 = (ulong)uVar8;
  }
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_148 = 0;
  local_140 = 0;
  local_130 = (Data *)0x0;
  local_1a8._M_dataplus._M_p = (pointer)0x0;
  local_1a8._M_string_length = 0;
  local_1a8.field_2._M_allocated_capacity = 0;
  local_1a8.field_2._8_8_ = 0;
  local_170 = 0;
  sStack_168 = 0;
  local_160 = 0;
  sStack_158 = 0;
  local_150 = &local_140;
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
            ::operator[](&this->mAccessorLibrary,pID);
  pmVar11->mOffset = local_1a8.field_2._M_allocated_capacity;
  pmVar11->mStride = local_1a8.field_2._8_8_;
  pmVar11->mCount = (size_t)local_1a8._M_dataplus._M_p;
  pmVar11->mSize = local_1a8._M_string_length;
  local_1e8._0_8_ =
       (pmVar11->mParams).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_1e8._8_8_ =
       (pmVar11->mParams).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_1e8._16_8_ =
       (pmVar11->mParams).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (pmVar11->mParams).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       local_188.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (pmVar11->mParams).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       local_188.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (pmVar11->mParams).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       local_188.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1e8);
  pmVar11->mSubOffset[2] = local_160;
  pmVar11->mSubOffset[3] = sStack_158;
  pmVar11->mSubOffset[0] = local_170;
  pmVar11->mSubOffset[1] = sStack_168;
  std::__cxx11::string::operator=((string *)&pmVar11->mSource,(string *)&local_150);
  pmVar11->mData = local_130;
  if (local_150 != &local_140) {
    operator_delete(local_150,CONCAT71(uStack_13f,local_140) + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  pmVar11 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Accessor>_>_>
            ::operator[](&this->mAccessorLibrary,pID);
  pmVar11->mCount = (ulong)uVar6;
  pmVar11->mOffset = local_208;
  pmVar11->mStride = uVar10;
  __s = local_1c0 + 1;
  pcVar4 = (char *)(pmVar11->mSource)._M_string_length;
  strlen(__s);
  std::__cxx11::string::_M_replace((ulong)&pmVar11->mSource,0,pcVar4,(ulong)__s);
  pmVar11->mSize = 0;
  iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
  if ((char)iVar7 != '\0') {
    psVar1 = pmVar11->mSubOffset + 1;
    psVar2 = pmVar11->mSubOffset;
    psVar3 = pmVar11->mSubOffset + 2;
    local_1b8 = pmVar11->mSubOffset + 3;
    do {
      paVar15 = &local_1a8.field_2;
      iVar7 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      iVar9 = (*this->mReader->_vptr_IIrrXMLReader[3])();
      if (iVar7 == 1) {
        if (iVar9 != 1) {
          __assert_fail("mReader->getNodeType() == irr::io::EXN_ELEMENT",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Collada/ColladaParser.h"
                        ,0x178,"bool Assimp::ColladaParser::IsElement(const char *) const");
        }
        iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar7 = strcmp((char *)CONCAT44(extraout_var_00,iVar7),"param");
        if (iVar7 != 0) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_1a8,"Unexpected sub element <",0x18);
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
          local_1b0 = (char *)CONCAT44(extraout_var_04,iVar7);
          poVar13 = (ostream *)
                    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                    operator<<((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                               &local_1a8,&local_1b0);
          std::__ostream_insert<char,std::char_traits<char>>(poVar13,"> in tag <accessor>",0x13);
          std::__cxx11::stringbuf::str();
          ThrowException(this,(string *)local_1e8);
        }
        iVar7 = TestAttribute(this,"name");
        local_1a8._M_string_length = 0;
        local_1a8.field_2._M_allocated_capacity =
             local_1a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_1a8._M_dataplus._M_p = (pointer)paVar15;
        if (-1 < iVar7) {
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[6])();
          sVar5 = local_1a8._M_string_length;
          strlen((char *)CONCAT44(extraout_var_01,iVar7));
          std::__cxx11::string::_M_replace
                    ((ulong)&local_1a8,0,(char *)sVar5,CONCAT44(extraout_var_01,iVar7));
          iVar7 = std::__cxx11::string::compare((char *)&local_1a8);
          psVar14 = psVar2;
          if (((((iVar7 == 0) ||
                (iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar1,
                iVar7 == 0)) ||
               (iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar3,
               iVar7 == 0)) ||
              ((((iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar2,
                 iVar7 == 0 ||
                 (iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar1,
                 iVar7 == 0)) ||
                ((iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar3,
                 iVar7 == 0 ||
                 ((iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = local_1b8,
                  iVar7 == 0 ||
                  (iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar2,
                  iVar7 == 0)))))) ||
               (iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar1,
               iVar7 == 0)))) ||
             (((iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar3,
               iVar7 == 0 ||
               (iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar2,
               iVar7 == 0)) ||
              (iVar7 = std::__cxx11::string::compare((char *)&local_1a8), psVar14 = psVar1,
              iVar7 == 0)))) {
            *psVar14 = (long)(pmVar11->mParams).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pmVar11->mParams).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5;
          }
        }
        uVar6 = TestAttribute(this,"type");
        if (-1 < (int)uVar6) {
          iVar7 = (*this->mReader->_vptr_IIrrXMLReader[6])(this->mReader,(ulong)uVar6);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_1e8,(char *)CONCAT44(extraout_var_02,iVar7),
                     (allocator<char> *)&local_1b0);
          iVar7 = std::__cxx11::string::compare((char *)local_1e8);
          lVar12 = 1;
          if (iVar7 == 0) {
            lVar12 = 0x10;
          }
          pmVar11->mSize = pmVar11->mSize + lVar12;
          if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&pmVar11->mParams,&local_1a8);
        SkipElement(this);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
          operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
        }
      }
      else if (iVar9 == 2) {
        iVar7 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
        iVar7 = strcmp((char *)CONCAT44(extraout_var_03,iVar7),"accessor");
        if (iVar7 == 0) {
          return;
        }
        local_1a8._M_dataplus._M_p = (pointer)paVar15;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1a8,"Expected end of <accessor> element.","");
        ThrowException(this,&local_1a8);
      }
      iVar7 = (*this->mReader->_vptr_IIrrXMLReader[2])();
    } while ((char)iVar7 != '\0');
  }
  return;
}

Assistant:

void ColladaParser::ReadAccessor(const std::string& pID)
{
    // read accessor attributes
    int attrSource = GetAttribute("source");
    const char* source = mReader->getAttributeValue(attrSource);
    if (source[0] != '#')
        ThrowException(format() << "Unknown reference format in url \"" << source << "\" in source attribute of <accessor> element.");
    int attrCount = GetAttribute("count");
    unsigned int count = (unsigned int)mReader->getAttributeValueAsInt(attrCount);
    int attrOffset = TestAttribute("offset");
    unsigned int offset = 0;
    if (attrOffset > -1)
        offset = (unsigned int)mReader->getAttributeValueAsInt(attrOffset);
    int attrStride = TestAttribute("stride");
    unsigned int stride = 1;
    if (attrStride > -1)
        stride = (unsigned int)mReader->getAttributeValueAsInt(attrStride);

    // store in the library under the given ID
    mAccessorLibrary[pID] = Accessor();
    Accessor& acc = mAccessorLibrary[pID];
    acc.mCount = count;
    acc.mOffset = offset;
    acc.mStride = stride;
    acc.mSource = source + 1; // ignore the leading '#'
    acc.mSize = 0; // gets incremented with every param

    // and read the components
    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (IsElement("param"))
            {
                // read data param
                int attrName = TestAttribute("name");
                std::string name;
                if (attrName > -1)
                {
                    name = mReader->getAttributeValue(attrName);

                    // analyse for common type components and store it's sub-offset in the corresponding field

                    /* Cartesian coordinates */
                    if (name == "X") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "Y") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "Z") acc.mSubOffset[2] = acc.mParams.size();

                    /* RGBA colors */
                    else if (name == "R") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "G") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "B") acc.mSubOffset[2] = acc.mParams.size();
                    else if (name == "A") acc.mSubOffset[3] = acc.mParams.size();

                    /* UVWQ (STPQ) texture coordinates */
                    else if (name == "S") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "T") acc.mSubOffset[1] = acc.mParams.size();
                    else if (name == "P") acc.mSubOffset[2] = acc.mParams.size();
                    //  else if( name == "Q") acc.mSubOffset[3] = acc.mParams.size();
                        /* 4D uv coordinates are not supported in Assimp */

                        /* Generic extra data, interpreted as UV data, too*/
                    else if (name == "U") acc.mSubOffset[0] = acc.mParams.size();
                    else if (name == "V") acc.mSubOffset[1] = acc.mParams.size();
                    //else
                    //  DefaultLogger::get()->warn( format() << "Unknown accessor parameter \"" << name << "\". Ignoring data channel." );
                }

                // read data type
                int attrType = TestAttribute("type");
                if (attrType > -1)
                {
                    // for the moment we only distinguish between a 4x4 matrix and anything else.
                    // TODO: (thom) I don't have a spec here at work. Check if there are other multi-value types
                    // which should be tested for here.
                    std::string type = mReader->getAttributeValue(attrType);
                    if (type == "float4x4")
                        acc.mSize += 16;
                    else
                        acc.mSize += 1;
                }

                acc.mParams.push_back(name);

                // skip remaining stuff of this element, if any
                SkipElement();
            }
            else
            {
                ThrowException(format() << "Unexpected sub element <" << mReader->getNodeName() << "> in tag <accessor>");
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
        {
            if (strcmp(mReader->getNodeName(), "accessor") != 0)
                ThrowException("Expected end of <accessor> element.");
            break;
        }
    }
}